

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collate.cpp
# Opt level: O0

long __thiscall
booster::locale::impl_std::utf8_collator_from_wide::do_hash
          (utf8_collator_from_wide *this,char *b,char *e)

{
  collate *pcVar1;
  wchar_t *pwVar2;
  long lVar3;
  char *in_RSI;
  char *in_RDI;
  wstring tmp;
  undefined8 in_stack_ffffffffffffff60;
  string *in_stack_ffffffffffffff68;
  allocator local_59;
  string local_58 [32];
  wstring local_38 [56];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_58,"UTF-8",&local_59);
  conv::to_utf<wchar_t>
            (in_RSI,in_RDI,in_stack_ffffffffffffff68,
             (method_type)((ulong)in_stack_ffffffffffffff60 >> 0x20));
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  pcVar1 = std::use_facet<std::__cxx11::collate<wchar_t>>((locale *)(in_RDI + 0x18));
  pwVar2 = (wchar_t *)std::__cxx11::wstring::c_str();
  std::__cxx11::wstring::c_str();
  std::__cxx11::wstring::size();
  lVar3 = std::__cxx11::collate<wchar_t>::hash((wchar_t *)pcVar1,pwVar2);
  std::__cxx11::wstring::~wstring(local_38);
  return lVar3;
}

Assistant:

virtual long do_hash(char const *b,char const *e) const
    {
        std::wstring tmp=conv::to_utf<wchar_t>(b,e,"UTF-8");
        return std::use_facet<wfacet>(base_).hash(tmp.c_str(),tmp.c_str()+tmp.size());
    }